

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O3

size_t ZSTD_count_2segments(BYTE *ip,BYTE *match,BYTE *iEnd,BYTE *mEnd,BYTE *iStart)

{
  ulong *puVar1;
  long lVar2;
  size_t sVar3;
  int *piVar4;
  long lVar5;
  ulong *puVar6;
  int *piVar7;
  int *piVar8;
  ulong uVar9;
  ulong uVar10;
  
  piVar7 = (int *)(ip + ((long)mEnd - (long)match));
  if (iEnd <= ip + ((long)mEnd - (long)match)) {
    piVar7 = (int *)iEnd;
  }
  piVar4 = (int *)ip;
  piVar8 = (int *)match;
  if (ip < (ulong *)((long)piVar7 - 7U)) {
    if (*(ulong *)match == *(ulong *)ip) {
      lVar5 = 0;
      do {
        if ((ulong *)((long)piVar7 - 7U) <= ip + lVar5 + 8) {
          piVar8 = (int *)(match + lVar5 + 8);
          piVar4 = (int *)(ip + lVar5 + 8);
          goto LAB_00700032;
        }
        lVar2 = lVar5 + 8;
        uVar10 = *(ulong *)(ip + lVar5 + 8);
        lVar5 = lVar5 + 8;
      } while (*(ulong *)(match + lVar2) == uVar10);
      uVar10 = uVar10 ^ *(ulong *)(match + lVar2);
      uVar9 = 0;
      if (uVar10 != 0) {
        for (; (uVar10 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
        }
      }
      sVar3 = (uVar9 >> 3 & 0x1fffffff) + lVar5;
    }
    else {
      uVar9 = *(ulong *)ip ^ *(ulong *)match;
      uVar10 = 0;
      if (uVar9 != 0) {
        for (; (uVar9 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
        }
      }
      sVar3 = uVar10 >> 3 & 0x1fffffff;
    }
  }
  else {
LAB_00700032:
    if ((piVar4 < (int *)((long)piVar7 - 3U)) && (*piVar8 == *piVar4)) {
      piVar4 = piVar4 + 1;
      piVar8 = piVar8 + 1;
    }
    if ((piVar4 < (int *)((long)piVar7 - 1U)) && ((short)*piVar8 == (short)*piVar4)) {
      piVar4 = (int *)((long)piVar4 + 2);
      piVar8 = (int *)((long)piVar8 + 2);
    }
    if (piVar4 < piVar7) {
      piVar4 = (int *)((long)piVar4 + (ulong)((char)*piVar8 == (char)*piVar4));
    }
    sVar3 = (long)piVar4 - (long)ip;
  }
  if (match + sVar3 == mEnd) {
    puVar1 = (ulong *)(ip + sVar3);
    puVar6 = puVar1;
    if (puVar1 < iEnd + -7) {
      if (*(ulong *)iStart == *puVar1) {
        lVar5 = 0;
        do {
          if (iEnd + -7 <= ip + lVar5 + sVar3 + 8) {
            iStart = iStart + lVar5 + 8;
            puVar6 = (ulong *)(ip + lVar5 + sVar3 + 8);
            goto LAB_007000f9;
          }
          lVar2 = lVar5 + 8;
          uVar10 = *(ulong *)(ip + lVar5 + sVar3 + 8);
          lVar5 = lVar5 + 8;
        } while (*(ulong *)(iStart + lVar2) == uVar10);
        uVar10 = uVar10 ^ *(ulong *)(iStart + lVar2);
        uVar9 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
          }
        }
        uVar10 = (uVar9 >> 3 & 0x1fffffff) + lVar5;
      }
      else {
        uVar9 = *puVar1 ^ *(ulong *)iStart;
        uVar10 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
          }
        }
        uVar10 = uVar10 >> 3 & 0x1fffffff;
      }
    }
    else {
LAB_007000f9:
      if ((puVar6 < iEnd + -3) && (*(int *)iStart == (int)*puVar6)) {
        puVar6 = (ulong *)((long)puVar6 + 4);
        iStart = (BYTE *)((long)iStart + 4);
      }
      if ((puVar6 < iEnd + -1) && ((short)*(int *)iStart == (short)*puVar6)) {
        puVar6 = (ulong *)((long)puVar6 + 2);
        iStart = (BYTE *)((long)iStart + 2);
      }
      if (puVar6 < iEnd) {
        puVar6 = (ulong *)((long)puVar6 + (ulong)((char)*(int *)iStart == (char)*puVar6));
      }
      uVar10 = (long)puVar6 - (long)puVar1;
    }
    sVar3 = sVar3 + uVar10;
  }
  return sVar3;
}

Assistant:

MEM_STATIC size_t
ZSTD_count_2segments(const BYTE* ip, const BYTE* match,
                     const BYTE* iEnd, const BYTE* mEnd, const BYTE* iStart)
{
    const BYTE* const vEnd = MIN( ip + (mEnd - match), iEnd);
    size_t const matchLength = ZSTD_count(ip, match, vEnd);
    if (match + matchLength != mEnd) return matchLength;
    DEBUGLOG(7, "ZSTD_count_2segments: found a 2-parts match (current length==%zu)", matchLength);
    DEBUGLOG(7, "distance from match beginning to end dictionary = %zi", mEnd - match);
    DEBUGLOG(7, "distance from current pos to end buffer = %zi", iEnd - ip);
    DEBUGLOG(7, "next byte : ip==%02X, istart==%02X", ip[matchLength], *iStart);
    DEBUGLOG(7, "final match length = %zu", matchLength + ZSTD_count(ip+matchLength, iStart, iEnd));
    return matchLength + ZSTD_count(ip+matchLength, iStart, iEnd);
}